

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O1

void prf_header_entry_f(prf_node_t *node,prf_state_t *state)

{
  prf_node_t **pppVar1;
  char *pcVar2;
  
  if (node->opcode != prf_header_info.opcode) {
    prf_error(9,"header entry state method tried on node of type %d.");
    return;
  }
  if (state->header == node || state->header == (prf_node_t *)0x0) {
    state->header = node;
    pppVar1 = (prf_node_t **)prf_array_set_count(state->materials,0);
    state->materials = pppVar1;
    if (state->model != (prf_model_t *)0x0) {
      state->model->ofversion = *(uint16_t *)(node->data + 8);
      return;
    }
    pcVar2 = "model is ";
  }
  else {
    pcVar2 = "header entry: a header node is already registered";
  }
  prf_error(9,pcVar2);
  return;
}

Assistant:

static
void
prf_header_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_header_info.opcode ) {
        prf_error( 9, "header entry state method tried on node of type %d.",
            node->opcode );
        return;
    }

    if ( state->header != NULL && state->header != node ) {
        prf_error( 9, "header entry: a header node is already registered" );
        return;
    }


    state->header = node;
    state->materials = (prf_node_t **)prf_array_set_count( state->materials,0);

    if ( state->model == NULL ) {
        prf_error( 9, "model is " );
    } else {
        node_data * data;
        data = (node_data *) node->data;
        state->model->ofversion = data->format_revision_level;
    }

}